

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O0

void __thiscall cs::statement_switch::run_impl(statement_switch *this)

{
  element_type *key_00;
  size_t sVar1;
  statement_base *this_00;
  raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
  *in_RDI;
  var key;
  undefined1 in_stack_000008ef;
  iterator *in_stack_000008f0;
  runtime_type *in_stack_000008f8;
  tree_type<cs::token_base_*> *in_stack_ffffffffffffffa8;
  statement_base *in_stack_ffffffffffffffb0;
  key_arg<cs_impl::any> *key_01;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
  *in_stack_ffffffffffffffd0;
  key_arg<cs_impl::any> local_10 [2];
  
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x5de43c);
  key_00 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x5de448);
  tree_type<cs::token_base_*>::root(in_stack_ffffffffffffffa8);
  key_01 = local_10;
  runtime_type::parse_expr(in_stack_000008f8,in_stack_000008f0,(bool)in_stack_000008ef);
  sVar1 = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
          ::count<cs_impl::any>(in_stack_ffffffffffffffd0,key_01);
  if (sVar1 == 0) {
    if ((in_RDI->
        super_raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
        ).settings_.
        super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
        .
        super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>,_0UL,_false>
        .value != 0) {
      statement_base::run(in_stack_ffffffffffffffb0);
    }
  }
  else {
    this_00 = (statement_base *)
              phmap::priv::
              raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs::statement_block*>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs::statement_block*>>>
              ::
              operator[]<cs_impl::any,phmap::priv::FlatHashMapPolicy<cs_impl::any,cs::statement_block*>>
                        (in_RDI,(key_arg<cs_impl::any> *)key_00);
    statement_base::run(this_00);
  }
  cs_impl::any::~any((any *)0x5de50f);
  return;
}

Assistant:

void statement_switch::run_impl()
	{
		CS_DEBUGGER_STEP(this);
		var key = context->instance->parse_expr(mTree.root());
		if (mCases.count(key) > 0)
			mCases[key]->run();
		else if (mDefault != nullptr)
			mDefault->run();
	}